

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O3

mod2entry * mod2sparse_find(mod2sparse *m,int row,int col)

{
  byte *pbVar1;
  uint uVar2;
  int col_00;
  bool bVar3;
  int iVar4;
  mod2entry *extraout_RAX;
  mod2entry *extraout_RAX_00;
  mod2entry *extraout_RAX_01;
  mod2entry *pmVar5;
  mod2entry *extraout_RAX_02;
  mod2entry *pmVar6;
  mod2entry *r;
  mod2entry *r_00;
  void *__s;
  undefined4 in_register_00000034;
  mod2entry *pmVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  
  pmVar7 = (mod2entry *)CONCAT44(in_register_00000034,row);
  if ((((-1 < row) && (-1 < col)) && (row < m->n_rows)) && (col < m->n_cols)) {
    pmVar7 = m->rows[(uint)row].left;
    if (-1 < pmVar7->row) {
      pmVar5 = m->rows + (uint)row;
      if (col <= pmVar7->col) {
        if (pmVar7->col == col) {
          return pmVar7;
        }
        pmVar7 = m->cols + (uint)col;
        pmVar6 = m->cols[(uint)col].up;
        uVar2 = pmVar6->row;
        if (row <= (int)uVar2) {
          do {
            if (uVar2 == row) {
              return pmVar6;
            }
            pmVar5 = pmVar5->right;
            if (pmVar5->row < 0) {
              return (mod2entry *)0x0;
            }
            iVar9 = pmVar5->col;
            if (iVar9 != col && col <= iVar9) {
              return (mod2entry *)0x0;
            }
            if (iVar9 == col) {
              return pmVar5;
            }
            pmVar7 = pmVar7->down;
            uVar2 = pmVar7->row;
            pmVar6 = pmVar7;
          } while (uVar2 <= (uint)row);
        }
      }
    }
    return (mod2entry *)0x0;
  }
  mod2sparse_find_cold_1();
  if (pmVar7 != (mod2entry *)0x0) {
    if ((-1 < pmVar7->row) && (-1 < pmVar7->col)) {
      pmVar5 = pmVar7->left;
      pmVar6 = pmVar7->right;
      pmVar5->right = pmVar6;
      pmVar6->left = pmVar5;
      pmVar5 = pmVar7->up;
      pmVar6 = pmVar7->down;
      pmVar5->down = pmVar6;
      pmVar6->up = pmVar5;
      pmVar7->left = ((mod2entry *)m)->down;
      ((mod2entry *)m)->down = pmVar7;
      return extraout_RAX;
    }
    mod2sparse_delete_cold_1();
  }
  mod2sparse_delete_cold_2();
  uVar2 = ((mod2entry *)m)->row;
  if ((uVar2 == pmVar7->row) && (((mod2entry *)m)->col == pmVar7->col)) {
    if (0 < (int)uVar2) {
      uVar8 = 0;
      do {
        pmVar5 = pmVar7->left[uVar8].right;
        for (pmVar6 = ((mod2entry *)m)->left[uVar8].right; -1 < pmVar6->row; pmVar6 = pmVar6->right)
        {
          if (pmVar5->row < 0) {
            return (mod2entry *)0x0;
          }
          if (pmVar6->col != pmVar5->col) {
            return (mod2entry *)0x0;
          }
          pmVar5 = pmVar5->right;
        }
        if (-1 < pmVar5->row) {
          return (mod2entry *)0x0;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar2);
    }
    return (mod2entry *)0x1;
  }
  mod2sparse_equal_cold_1();
  if ((((mod2entry *)m)->row == pmVar7->col) && (((mod2entry *)m)->col == pmVar7->row)) {
    if (pmVar7 != (mod2entry *)m) {
      mod2sparse_clear((mod2sparse *)pmVar7);
      pmVar5 = (mod2entry *)(ulong)(uint)((mod2entry *)m)->row;
      if (0 < ((mod2entry *)m)->row) {
        lVar11 = 0;
        do {
          pmVar6 = ((mod2entry *)m)->left[lVar11].right;
          if (-1 < pmVar6->row) {
            do {
              mod2sparse_insert((mod2sparse *)pmVar7,pmVar6->col,(int)lVar11);
              pmVar6 = pmVar6->right;
            } while (-1 < pmVar6->row);
            pmVar5 = (mod2entry *)(ulong)(uint)((mod2entry *)m)->row;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < (int)pmVar5);
      }
      return pmVar5;
    }
  }
  else {
    mod2sparse_transpose_cold_1();
  }
  mod2sparse_transpose_cold_2();
  if ((((((mod2entry *)m)->row == r->row) && (((mod2entry *)m)->col == r->col)) &&
      (pmVar7->row == ((mod2entry *)m)->row)) && (pmVar7->col == ((mod2entry *)m)->col)) {
    if ((r != (mod2entry *)m) && (r != pmVar7)) {
      mod2sparse_clear((mod2sparse *)r);
      if (r->row < 1) {
        return extraout_RAX_00;
      }
      lVar11 = 0;
LAB_00121c86:
      pmVar5 = ((mod2entry *)m)->left[lVar11].right;
      pmVar6 = pmVar7->left[lVar11].right;
      while (iVar9 = (int)lVar11, -1 < pmVar5->row) {
        if (pmVar6->row < 0) goto LAB_00121cda;
        iVar4 = pmVar5->col;
        col_00 = pmVar6->col;
        if (iVar4 == col_00) {
          pmVar5 = pmVar5->right;
LAB_00121cd4:
          pmVar6 = pmVar6->right;
        }
        else {
          if (col_00 <= iVar4) {
            mod2sparse_insert((mod2sparse *)r,iVar9,col_00);
            goto LAB_00121cd4;
          }
          mod2sparse_insert((mod2sparse *)r,iVar9,iVar4);
          pmVar5 = pmVar5->right;
        }
      }
      goto LAB_00121d07;
    }
  }
  else {
    mod2sparse_add_cold_1();
  }
  mod2sparse_add_cold_2();
  if (((((mod2entry *)m)->col == pmVar7->row) && (((mod2entry *)m)->row == r_00->row)) &&
     (pmVar7->col == r_00->col)) {
    if ((r_00 != (mod2entry *)m) && (r_00 != pmVar7)) {
      mod2sparse_clear((mod2sparse *)r_00);
      iVar9 = ((mod2entry *)m)->row;
      pmVar5 = extraout_RAX_01;
      if (0 < iVar9) {
        lVar11 = 0;
        do {
          if ((-1 < (((mod2entry *)m)->left[lVar11].right)->row) && (iVar4 = pmVar7->col, 0 < iVar4)
             ) {
            lVar10 = 0;
            do {
              pmVar5 = ((mod2entry *)m)->left[lVar11].right;
              if (-1 < pmVar5->row) {
                pmVar6 = pmVar7->right[lVar10].down;
                bVar3 = false;
                do {
                  iVar9 = pmVar6->row;
                  if (iVar9 < 0) break;
                  if (pmVar5->col == iVar9) {
                    bVar3 = (bool)(bVar3 ^ 1);
                    pmVar5 = pmVar5->right;
LAB_00121de9:
                    pmVar6 = pmVar6->down;
                  }
                  else {
                    if (iVar9 <= pmVar5->col) goto LAB_00121de9;
                    pmVar5 = pmVar5->right;
                  }
                } while (-1 < pmVar5->row);
                if (bVar3) {
                  mod2sparse_insert((mod2sparse *)r_00,(int)lVar11,(int)lVar10);
                  iVar4 = pmVar7->col;
                }
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < iVar4);
            iVar9 = ((mod2entry *)m)->row;
          }
          lVar11 = lVar11 + 1;
          pmVar5 = (mod2entry *)(long)iVar9;
        } while (lVar11 < (long)pmVar5);
      }
      return pmVar5;
    }
  }
  else {
    mod2sparse_multiply_cold_1();
  }
  mod2sparse_multiply_cold_2();
  uVar2 = ((mod2entry *)m)->col;
  pmVar5 = extraout_RAX_02;
  if (0 < (long)((mod2entry *)m)->row) {
    pmVar5 = (mod2entry *)memset(__s,0,(long)((mod2entry *)m)->row);
  }
  if (0 < (int)uVar2) {
    pmVar5 = (mod2entry *)0x0;
    do {
      if (*(char *)((long)&pmVar5->row + (long)&pmVar7->row) != '\0') {
        for (pmVar6 = ((mod2entry *)m)->right[(long)pmVar5].down; -1 < pmVar6->row;
            pmVar6 = pmVar6->down) {
          pbVar1 = (byte *)((long)__s + (ulong)(uint)pmVar6->row);
          *pbVar1 = *pbVar1 ^ 1;
        }
      }
      pmVar5 = (mod2entry *)((long)&pmVar5->row + 1);
    } while (pmVar5 != (mod2entry *)(ulong)uVar2);
  }
  return pmVar5;
LAB_00121cda:
  do {
    mod2sparse_insert((mod2sparse *)r,iVar9,pmVar5->col);
    pmVar5 = pmVar5->right;
  } while (-1 < pmVar5->row);
LAB_00121d07:
  for (; -1 < pmVar6->row; pmVar6 = pmVar6->right) {
    mod2sparse_insert((mod2sparse *)r,iVar9,pmVar6->col);
  }
  lVar11 = lVar11 + 1;
  if (r->row <= lVar11) {
    return (mod2entry *)(long)r->row;
  }
  goto LAB_00121c86;
}

Assistant:

mod2entry *mod2sparse_find
( mod2sparse *m,
  int row,
  int col
)
{ 
  mod2entry *re, *ce;

  if (row<0 || row>=mod2sparse_rows(m) || col<0 || col>=mod2sparse_cols(m))
  { fprintf(stderr,"mod2sparse_find: row or column index out of bounds\n");
    exit(1);
  }

  /* Check last entries in row and column. */

  re = mod2sparse_last_in_row(m,row);
  if (mod2sparse_at_end(re) || mod2sparse_col(re)<col) 
  { return 0;
  }
  if (mod2sparse_col(re)==col) 
  { return re;
  }

  ce = mod2sparse_last_in_col(m,col);
  if (mod2sparse_at_end(ce) || mod2sparse_row(ce)<row)
  { return 0;
  }
  if (mod2sparse_row(ce)==row)
  { return ce;
  }

  /* Search row and column in parallel, from the front. */

  re = mod2sparse_first_in_row(m,row);
  ce = mod2sparse_first_in_col(m,col);

  for (;;)
  { 
    if (mod2sparse_at_end(re) || mod2sparse_col(re)>col)
    { return 0;
    } 
    if (mod2sparse_col(re)==col) 
    { return re;
    }

    if (mod2sparse_at_end(ce) || mod2sparse_row(ce)>row)
    { return 0;
    } 
    if (mod2sparse_row(ce)==row)
    { return ce;
    }

    re = mod2sparse_next_in_row(re);
    ce = mod2sparse_next_in_col(ce);
  }
}